

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O2

int testConstant(void)

{
  uint uVar1;
  Scalar *pSVar2;
  ostream *poVar3;
  Matrix *pMVar4;
  long lVar5;
  uint i;
  uint uVar6;
  ConstantReturnType *pCVar7;
  Matrix4 *pMVar8;
  byte bVar9;
  Vector uConstant;
  Vector yConstant;
  Vector xh0;
  Vector3 contact;
  Vector4 v;
  Vector v2;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  ConstantReturnType *local_558;
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *local_550;
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_538 [80];
  IndexedMatrixArray y;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_4e0 [80];
  ofstream f;
  IndexedMatrixArray xh;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_288 [80];
  Matrix4 local_238;
  Matrix4 m;
  Matrix4 local_138;
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> local_b8 [136];
  
  bVar9 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&contact,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&f);
  contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.311236;
  contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -0.355773;
  contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&f,6,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&yConstant,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&f);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&yConstant,1);
  *pSVar2 = 9.8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&f,0xf,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&uConstant,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&f);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uConstant,2);
  *pSVar2 = 1.8;
  for (uVar6 = 1; uVar6 != 0x1389; uVar6 = uVar6 + 1) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&f,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&yConstant);
    stateObservation::IndexedMatrixArray::setValue(&y,(Matrix *)&f,uVar6);
    free((void *)_f);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&f,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&uConstant);
    stateObservation::IndexedMatrixArray::setValue(&u,(Matrix *)&f,uVar6);
    free((void *)_f);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&f,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&uConstant);
  stateObservation::IndexedMatrixArray::pushBack(&u,(Matrix *)&f);
  free((void *)_f);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&f,0x12,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&f);
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(&contactPositions,&contact);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&f,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xh0);
  stateObservation::examples::offlineEKFFlexibilityEstimation
            (&xh,&y,(Matrix *)&u,(uint)&f,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1,0.0,(IndexedMatrixArray *)&contactPositions,(IndexedMatrixArray *)0x0);
  free((void *)_f);
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,0x12b0e8);
  uVar6 = stateObservation::IndexedMatrixArray::getFirstIndex(&xh);
  while( true ) {
    uVar1 = stateObservation::IndexedMatrixArray::getLastIndex(&xh);
    if (uVar1 < uVar6) break;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&f);
    poVar3 = std::operator<<(poVar3," ");
    m.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         (double)stateObservation::IndexedMatrixArray::operator[](&xh,uVar6);
    poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&m);
    std::endl<char,std::char_traits<char>>(poVar3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero((ConstantReturnType *)&m,6,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,1,0,_1,1> *)&v2,(ConstantReturnType *)&m);
    pMVar4 = stateObservation::IndexedMatrixArray::operator[](&xh,uVar6);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&v,pMVar4);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&m,
               (Matrix<double,__1,_1,_0,__1,_1> *)&v,0,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)local_b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_b8,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&m);
    free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                 array[0]);
    pMVar4 = stateObservation::IndexedMatrixArray::operator[](&xh,uVar6);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&v,pMVar4);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&m,
               (Matrix<double,__1,_1,_0,__1,_1> *)&v,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              ((Type *)local_b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v2,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_b8,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&m);
    free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                 array[0]);
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v2);
    stateObservation::kine::vector6ToHomogeneousMatrix(&m,(Vector6 *)local_b8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)local_b8,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&v,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)local_b8,&contact);
    v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] = 1.0;
    pCVar7 = (ConstantReturnType *)&m;
    pMVar8 = &local_138;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
      [0] = (double)(pCVar7->m_rows).m_value;
      pCVar7 = (ConstantReturnType *)((long)pCVar7 + (ulong)bVar9 * -0x10 + 8);
      pMVar8 = (Matrix4 *)((long)pMVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    stateObservation::kine::invertHomoMatrix(&local_238,&local_138);
    stateObservation::kine::invertHomoMatrix((Matrix4 *)local_b8,&local_238);
    local_558 = (ConstantReturnType *)&m;
    local_550 = local_b8;
    poVar3 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                *)&local_558);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    free(v2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar6 = uVar6 + 1;
  }
  std::ofstream::~ofstream(&f);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_288);
  free(contactPositions.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(uConstant.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(yConstant.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_538);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_4e0);
  return 0;
}

Assistant:

int testConstant()
{
    /// The number of samples
    const unsigned kmax=5000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    Vector3 contact(Vector3::Zero());

    contact[0]=0.31123600000000001;
    contact[1]=-0.35577300000000001;
    contact[2]=1.1000000000000001;

    Vector yConstant = Vector::Zero(measurementSize,1);
    yConstant[1]=9.8;



    Vector uConstant = Vector::Zero(inputSize,1);
    uConstant[2]=1.8;

    {
        for ( unsigned i=1 ; i<kmax+1 ; ++i )
        {
            y.setValue(yConstant,i);
            u.setValue(uConstant,i);
        }
    }

    u.pushBack(uConstant);

    ///the initalization of a random estimation of the initial state
    Vector xh0=Vector::Zero(stateSize,1);

    std::vector<Vector3, Eigen::aligned_allocator<Vector3> > contactPositions;

    contactPositions.push_back(contact);

    stateObservation::IndexedMatrixArray xh=
        stateObservation::examples::offlineEKFFlexibilityEstimation
        (y,u,xh0,1,contactPositions,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    ///the reconstruction of the state
    for (unsigned i=xh.getFirstIndex();i<=xh.getLastIndex();++i)
    {
       f << i<<" "<< xh[i].transpose()
          << std::endl;

       Vector v2 (Matrix::Zero(6,1));

       v2.head(3) = Vector(xh[i]).segment(kine::pos,3);
       v2.tail(3) = Vector(xh[i]).segment(kine::ori,3);

       Matrix4 m= kine::vector6ToHomogeneousMatrix(v2);
       Vector4 v;
       v.head(3)=contact;
       v[3]=1;

       std::cout << m - kine::invertHomoMatrix(
                            kine::invertHomoMatrix(m))
                                        << std::endl << std::endl;

    }

    return 0;
}